

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteRawLittleEndian<8>
          (EpsCopyOutputStream *this,void *data,int size,uint8_t *ptr)

{
  uint8_t *puVar1;
  uint8_t *ptr_local;
  int size_local;
  void *data_local;
  EpsCopyOutputStream *this_local;
  
  puVar1 = WriteRaw(this,data,size,ptr);
  return puVar1;
}

Assistant:

inline uint8_t* EpsCopyOutputStream::WriteRawLittleEndian<8>(const void* data,
                                                             int size,
                                                             uint8_t* ptr) {
#if defined(ABSL_IS_LITTLE_ENDIAN) && \
    !defined(PROTOBUF_DISABLE_LITTLE_ENDIAN_OPT_FOR_TEST)
  return WriteRaw(data, size, ptr);
#else
  return WriteRawLittleEndian64(data, size, ptr);
#endif
}